

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::BasicWriter<char>::write_unsigned_decimal<unsigned_int>
          (BasicWriter<char> *this,uint value,uint prefix_size)

{
  uint uVar1;
  CharPtr p;
  char *buffer;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  char *ptr;
  uint num_digits;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = internal::count_digits(0);
  p = grow_buffer((BasicWriter<char> *)CONCAT44(in_ESI,in_EDX),
                  CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  buffer = get(p);
  internal::format_decimal<unsigned_int,char>(buffer,(uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  return buffer;
}

Assistant:

Char *write_unsigned_decimal(UInt value, unsigned prefix_size = 0) {
    unsigned num_digits = internal::count_digits(value);
    Char *ptr = get(grow_buffer(prefix_size + num_digits));
    internal::format_decimal(ptr + prefix_size, value, num_digits);
    return ptr;
  }